

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void btf_16_w16_avx2(__m256i w0,__m256i w1,__m256i *in0,__m256i *in1,__m256i _r,int32_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i d1;
  __m256i d0;
  __m256i c1;
  __m256i c0;
  __m256i b1;
  __m256i b0;
  __m256i a1;
  __m256i a0;
  __m256i v1;
  __m256i v0;
  __m256i u1;
  __m256i u0;
  __m256i t1;
  __m256i t0;
  
  auVar4 = vpunpcklwd_avx2(*in_RDI,*in_RSI);
  auVar3 = vpunpckhwd_avx2(*in_RDI,*in_RSI);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpmaddwd_avx2(auVar4,auVar1);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar2 = vpmaddwd_avx2(auVar3,auVar2);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar6._16_8_ = in_YMM1_H;
  auVar6._24_8_ = in_register_00001258;
  auVar4 = vpmaddwd_avx2(auVar4,auVar6);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = in_XMM1_Qa;
  auVar5._16_8_ = in_YMM1_H;
  auVar5._24_8_ = in_register_00001258;
  auVar3 = vpmaddwd_avx2(auVar3,auVar5);
  auVar10._8_8_ = in_XMM2_Qb;
  auVar10._0_8_ = in_XMM2_Qa;
  auVar10._16_8_ = in_YMM2_H;
  auVar10._24_8_ = in_register_00001298;
  auVar1 = vpaddd_avx2(auVar1,auVar10);
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = in_XMM2_Qa;
  auVar9._16_8_ = in_YMM2_H;
  auVar9._24_8_ = in_register_00001298;
  auVar2 = vpaddd_avx2(auVar2,auVar9);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = in_XMM2_Qa;
  auVar8._16_8_ = in_YMM2_H;
  auVar8._24_8_ = in_register_00001298;
  auVar4 = vpaddd_avx2(auVar4,auVar8);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = in_XMM2_Qa;
  auVar7._16_8_ = in_YMM2_H;
  auVar7._24_8_ = in_register_00001298;
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar4 = vpsrad_avx2(auVar4,ZEXT416(in_EDX));
  auVar3 = vpsrad_avx2(auVar3,ZEXT416(in_EDX));
  auVar1 = vpackssdw_avx2(auVar1,auVar2);
  *in_RDI = auVar1;
  auVar1 = vpackssdw_avx2(auVar4,auVar3);
  *in_RSI = auVar1;
  return;
}

Assistant:

static inline void btf_16_w16_avx2(const __m256i w0, const __m256i w1,
                                   __m256i *in0, __m256i *in1, const __m256i _r,
                                   const int32_t cos_bit) {
  __m256i t0 = _mm256_unpacklo_epi16(*in0, *in1);
  __m256i t1 = _mm256_unpackhi_epi16(*in0, *in1);
  __m256i u0 = _mm256_madd_epi16(t0, w0);
  __m256i u1 = _mm256_madd_epi16(t1, w0);
  __m256i v0 = _mm256_madd_epi16(t0, w1);
  __m256i v1 = _mm256_madd_epi16(t1, w1);

  __m256i a0 = _mm256_add_epi32(u0, _r);
  __m256i a1 = _mm256_add_epi32(u1, _r);
  __m256i b0 = _mm256_add_epi32(v0, _r);
  __m256i b1 = _mm256_add_epi32(v1, _r);

  __m256i c0 = _mm256_srai_epi32(a0, cos_bit);
  __m256i c1 = _mm256_srai_epi32(a1, cos_bit);
  __m256i d0 = _mm256_srai_epi32(b0, cos_bit);
  __m256i d1 = _mm256_srai_epi32(b1, cos_bit);

  *in0 = _mm256_packs_epi32(c0, c1);
  *in1 = _mm256_packs_epi32(d0, d1);
}